

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O0

Smt_Prs_t * Smt_PrsAlloc(char *pFileName,char *pBuffer,char *pLimit,int nObjs)

{
  Abc_Nam_t *pAVar1;
  Smt_Prs_t *p;
  int nObjs_local;
  char *pLimit_local;
  char *pBuffer_local;
  char *pFileName_local;
  
  if (nObjs == 0) {
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)calloc(1,0x448);
    *(char **)pFileName_local = pFileName;
    *(char **)(pFileName_local + 8) = pBuffer;
    *(char **)(pFileName_local + 0x10) = pLimit;
    *(char **)(pFileName_local + 0x18) = pBuffer;
    pAVar1 = Abc_NamStart(1000,0x18);
    *(Abc_Nam_t **)(pFileName_local + 0x20) = pAVar1;
    Smt_AddTypes(*(Abc_Nam_t **)(pFileName_local + 0x20));
    Vec_IntGrow((Vec_Int_t *)(pFileName_local + 0x28),100);
    Vec_WecGrow((Vec_Wec_t *)(pFileName_local + 0x38),nObjs + 1);
  }
  return (Smt_Prs_t *)pFileName_local;
}

Assistant:

static inline Smt_Prs_t * Smt_PrsAlloc( char * pFileName, char * pBuffer, char * pLimit, int nObjs )
{
    Smt_Prs_t * p;
    if ( nObjs == 0 )
        return NULL;
    p = ABC_CALLOC( Smt_Prs_t, 1 );
    p->pName   = pFileName;
    p->pBuffer = pBuffer;
    p->pLimit  = pLimit;
    p->pCur    = pBuffer;
    p->pStrs   = Abc_NamStart( 1000, 24 );
    Smt_AddTypes( p->pStrs );
    Vec_IntGrow( &p->vStack, 100 );
    //Vec_WecGrow( &p->vDepth, 100 );
    Vec_WecGrow( &p->vObjs, nObjs+1 );
    return p;
}